

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O3

void __thiscall
cmExportFileGenerator::PopulateSourcesInterface
          (cmExportFileGenerator *this,cmTargetExport *tei,PreprocessContext preprocessRule,
          ImportPropertyMap *properties,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *missingTargets)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmGeneratorTarget *this_00;
  bool bVar2;
  char *__s;
  size_t sVar3;
  mapped_type *pmVar4;
  string prepro;
  string local_70;
  string local_50;
  
  if (preprocessRule == InstallInterface) {
    this_00 = tei->Target;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"INTERFACE_SOURCES","");
    __s = cmGeneratorTarget::GetProperty(this_00,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if (__s != (char *)0x0) {
      if (*__s == '\0') {
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"INTERFACE_SOURCES","");
        pmVar4 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](properties,&local_70);
        pmVar4->_M_string_length = 0;
        *(pmVar4->_M_dataplus)._M_p = '\0';
      }
      else {
        paVar1 = &local_50.field_2;
        local_50._M_dataplus._M_p = (pointer)paVar1;
        sVar3 = strlen(__s);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,__s,__s + sVar3);
        cmGeneratorExpression::Preprocess(&local_70,&local_50,InstallInterface,true);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != paVar1) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if (local_70._M_string_length != 0) {
          ResolveTargetsInGeneratorExpression(this,&local_70,this_00,missingTargets);
          local_50._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,"INTERFACE_SOURCES","");
          bVar2 = checkInterfaceDirs(&local_70,this_00,&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != paVar1) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          if (bVar2) {
            local_50._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_50,"INTERFACE_SOURCES","");
            pmVar4 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](properties,&local_50);
            std::__cxx11::string::_M_assign((string *)pmVar4);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != paVar1) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
    }
    return;
  }
  __assert_fail("preprocessRule == cmGeneratorExpression::InstallInterface",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmExportFileGenerator.cxx"
                ,0x153,
                "void cmExportFileGenerator::PopulateSourcesInterface(cmTargetExport *, cmGeneratorExpression::PreprocessContext, ImportPropertyMap &, std::vector<std::string> &)"
               );
}

Assistant:

void cmExportFileGenerator::PopulateSourcesInterface(
  cmTargetExport* tei, cmGeneratorExpression::PreprocessContext preprocessRule,
  ImportPropertyMap& properties, std::vector<std::string>& missingTargets)
{
  cmGeneratorTarget* gt = tei->Target;
  assert(preprocessRule == cmGeneratorExpression::InstallInterface);

  const char* propName = "INTERFACE_SOURCES";
  const char* input = gt->GetProperty(propName);

  if (!input) {
    return;
  }

  if (!*input) {
    properties[propName].clear();
    return;
  }

  std::string prepro =
    cmGeneratorExpression::Preprocess(input, preprocessRule, true);
  if (!prepro.empty()) {
    this->ResolveTargetsInGeneratorExpressions(prepro, gt, missingTargets);

    if (!checkInterfaceDirs(prepro, gt, propName)) {
      return;
    }
    properties[propName] = prepro;
  }
}